

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>::
insert<std::basic_string_view<char,std::char_traits<char>>>
          (DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
           *this,string_view searchValue1,GlobalBrokerId *searchValue2,
          basic_string_view<char,_std::char_traits<char>_> *data)

{
  size_type sVar1;
  iterator iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  mapped_type *pmVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  optional<unsigned_long> oVar6;
  size_type index;
  string_view searchValue1_local;
  
  searchValue1_local._M_str = searchValue1._M_str;
  searchValue1_local._M_len = searchValue1._M_len;
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this + 0x18),(key_type *)&searchValue1_local);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    index = (size_type)
            CLI::std::
            _Hashtable<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x80),searchValue2);
    if ((__node_type *)index != (__node_type *)0x0) {
      uVar5 = 0;
      goto LAB_002cc5d2;
    }
  }
  index = (*(long *)(this + 8) - *(long *)this) / 0x58;
  std::vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>>
            ((vector<helics::BasicBrokerInfo,std::allocator<helics::BasicBrokerInfo>> *)this,data);
  StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *)
             (this + 0x50),(basic_string_view<char,_std::char_traits<char>_> *)&searchValue1_local);
  pbVar3 = StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(this + 0x50));
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,unsigned_long&>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)(this + 0x18),pbVar3,&index);
  sVar1 = index;
  pmVar4 = CLI::std::__detail::
           _Map_base<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<helics::GlobalBrokerId,_std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalBrokerId>,_std::hash<helics::GlobalBrokerId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(this + 0x80),searchValue2);
  *pmVar4 = sVar1;
  uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_002cc5d2:
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = index;
  return (optional<unsigned_long>)
         oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(
            std::string_view searchValue1,
            const searchType2& searchValue2,
            Us&&... data)
        {
            auto fnd = lookup1.find(searchValue1);
            if (fnd != lookup1.end()) {
                auto fnd2 = lookup2.find(searchValue2);
                if (fnd2 != lookup2.end()) {
                    return std::nullopt;
                }
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue1);
            lookup1.emplace(names.back(), index);
            lookup2[searchValue2] = index;
            return index;
        }